

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nu,int nv,Bounds2f domain,
          Allocator alloc)

{
  float fVar1;
  size_t n;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  span<const_float> f;
  vector<float,_std::allocator<float>_> marginalFunc;
  Allocator alloc_local;
  Bounds2f domain_local;
  size_t va;
  float *local_78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  Float local_40;
  Float FStack_3c;
  Float local_38;
  
  auVar9._8_56_ = domain._16_56_;
  auVar9._0_8_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar8._8_56_ = domain._8_56_;
  auVar8._0_8_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  pfVar2 = (float *)func.n;
  pfVar5 = func.ptr;
  domain_local = (Bounds2f)vmovlhps_avx(auVar8._0_16_,auVar9._0_16_);
  pfVar4 = (float *)(long)nu;
  n = (size_t)nv;
  marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(n * (long)pfVar4);
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar7 = ZEXT816(0) << 0x20;
  (this->pConditionalV).alloc.memoryResource = alloc.memoryResource;
  (this->pConditionalV).nStored = 0;
  (this->pConditionalV).ptr = (PiecewiseConstant1D *)auVar7._0_8_;
  (this->pConditionalV).nAlloc = auVar7._8_8_;
  (this->pMarginal).func.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).func.nStored = 0;
  (this->pMarginal).func.ptr = (float *)auVar7._0_8_;
  (this->pMarginal).func.nAlloc = auVar7._8_8_;
  (this->pMarginal).cdf.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).cdf.nStored = 0;
  (this->pMarginal).cdf.ptr = (float *)auVar7._0_8_;
  (this->pMarginal).cdf.nAlloc = auVar7._8_8_;
  (this->pMarginal).funcInt = 0.0;
  alloc_local = alloc;
  va = (size_t)pfVar2;
  if ((long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pfVar2 == 0) {
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::reserve(&this->pConditionalV,n);
    if (0 < nv) {
      uVar3 = (ulong)(uint)nv;
      do {
        local_78 = pfVar2;
        if (pfVar4 <= pfVar2) {
          local_78 = pfVar4;
        }
        va = (size_t)pfVar5;
        pstd::
        vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
        ::
        emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                  ((vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
                    *)&this->pConditionalV,(span<const_float> *)&va,(float *)&domain_local,
                   (float *)&domain_local.pMax,&alloc_local);
        pfVar5 = pfVar5 + (long)pfVar4;
        uVar3 = uVar3 - 1;
        pfVar2 = (float *)((long)pfVar2 - (long)pfVar4);
      } while (uVar3 != 0);
    }
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve(&marginalFunc,n);
    if (0 < nv) {
      lVar6 = 0;
      do {
        fVar1 = *(float *)((long)&((this->pConditionalV).ptr)->funcInt + lVar6);
        va = CONCAT44(va._4_4_,fVar1);
        if (marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&marginalFunc,
                     (iterator)
                     marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,(float *)&va);
        }
        else {
          *marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = fVar1;
          marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar6 = lVar6 + 0x50;
      } while ((ulong)(uint)nv * 0x50 != lVar6);
    }
    f.n = (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f.ptr = marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)&va,f,domain_local.pMin.super_Tuple2<pbrt::Point2,_float>.y,
               domain_local.pMax.super_Tuple2<pbrt::Point2,_float>.y,alloc_local);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->pMarginal).func,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->pMarginal).cdf,&local_60);
    (this->pMarginal).funcInt = local_38;
    (this->pMarginal).min = local_40;
    (this->pMarginal).max = FStack_3c;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_60);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
    if (marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
             ,0x30f,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [12])0x7cd1d8,
             (char (*) [24])"(size_t)nu * (size_t)nv",(char (*) [12])0x7cd1d8,&va,
             (char (*) [24])"(size_t)nu * (size_t)nv",(unsigned_long *)&marginalFunc);
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nu, int nv, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalV(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nu * (size_t)nv);
        pConditionalV.reserve(nv);
        for (int v = 0; v < nv; ++v)
            // Compute conditional sampling distribution for $\tilde{v}$
            pConditionalV.emplace_back(func.subspan(v * nu, nu), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{v}]$
        std::vector<Float> marginalFunc;
        marginalFunc.reserve(nv);
        for (int v = 0; v < nv; ++v)
            marginalFunc.push_back(pConditionalV[v].Integral());
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }